

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::Cluster::minBox(Cluster *this)

{
  undefined8 *in_RDI;
  int i;
  IntVect hi;
  IntVect lo;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 local_7c;
  undefined8 local_74;
  undefined8 local_6c;
  undefined4 local_64;
  int local_60;
  undefined8 local_5c;
  int local_54;
  undefined8 local_50;
  int local_48;
  undefined8 local_44;
  undefined8 local_3c;
  undefined8 local_34;
  undefined4 local_2c;
  int *local_20;
  undefined8 *local_18;
  int *local_10;
  undefined8 *local_8;
  
  if (in_RDI[5] == 0) {
    Box::Box((Box *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    *in_RDI = local_44;
    in_RDI[1] = local_3c;
    in_RDI[2] = local_34;
    *(undefined4 *)(in_RDI + 3) = local_2c;
  }
  else {
    local_5c = *(undefined8 *)in_RDI[4];
    local_54 = *(int *)((undefined8 *)in_RDI[4] + 1);
    local_50 = local_5c;
    local_48 = local_54;
    for (local_60 = 1; (long)local_60 < (long)in_RDI[5]; local_60 = local_60 + 1) {
      local_20 = (int *)(in_RDI[4] + (long)local_60 * 0xc);
      local_18 = &local_50;
      if ((int)local_50 < *local_20) {
        local_94 = (int)local_50;
      }
      else {
        local_94 = *local_20;
      }
      local_98 = local_50._4_4_;
      local_50._0_4_ = local_94;
      if (local_98 < local_20[1]) {
      }
      else {
        local_98 = local_20[1];
      }
      local_50._4_4_ = local_98;
      if (local_48 < local_20[2]) {
        local_9c = local_48;
      }
      else {
        local_9c = local_20[2];
      }
      local_48 = local_9c;
      local_10 = (int *)(in_RDI[4] + (long)local_60 * 0xc);
      local_8 = &local_5c;
      in_stack_ffffffffffffff54 = (int)local_5c;
      if ((int)local_5c <= *local_10) {
        in_stack_ffffffffffffff54 = *local_10;
      }
      in_stack_ffffffffffffff50 = local_5c._4_4_;
      local_5c._0_4_ = in_stack_ffffffffffffff54;
      if (in_stack_ffffffffffffff50 <= local_10[1]) {
        in_stack_ffffffffffffff50 = local_10[1];
      }
      local_5c._4_4_ = in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff4c = local_54;
      if (local_54 <= local_10[2]) {
        in_stack_ffffffffffffff4c = local_10[2];
      }
      local_54 = in_stack_ffffffffffffff4c;
    }
    Box::Box((Box *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (IntVect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (IntVect *)0x18df9c2);
    *in_RDI = local_7c;
    in_RDI[1] = local_74;
    in_RDI[2] = local_6c;
    *(undefined4 *)(in_RDI + 3) = local_64;
  }
  return;
}

Assistant:

void
Cluster::minBox () noexcept
{
    if (m_len == 0)
    {
        m_bx = Box();
    }
    else
    {
        IntVect lo = m_ar[0], hi = lo;
        for (int i = 1; i < m_len; i++)
        {
            lo.min(m_ar[i]);
            hi.max(m_ar[i]);
        }
        m_bx = Box(lo,hi);
    }
}